

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack8.h
# Opt level: O0

void ncnn::convdw5x5s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m256 _k44;
  __m256 _k43;
  __m256 _k42;
  __m256 _k41;
  __m256 _k40;
  __m256 _r44;
  __m256 _r43;
  __m256 _r42;
  __m256 _r41;
  __m256 _r40;
  __m256 _k34;
  __m256 _k33;
  __m256 _k32;
  __m256 _k31;
  __m256 _k30;
  __m256 _r34;
  __m256 _r33;
  __m256 _r32;
  __m256 _r31;
  __m256 _r30;
  __m256 _k24;
  __m256 _k23;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _r24;
  __m256 _r23;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _k14;
  __m256 _k13;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _r14;
  __m256 _r13;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _k04;
  __m256 _k03;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum0;
  int j;
  int i;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m256 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  Mat *m;
  Mat *m_1;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  float local_1ac0;
  float fStack_1abc;
  float fStack_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa8;
  float fStack_1aa4;
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  float fStack_1a88;
  float fStack_1a84;
  float local_1a80;
  float fStack_1a7c;
  float fStack_1a78;
  float fStack_1a74;
  float fStack_1a70;
  float fStack_1a6c;
  float fStack_1a68;
  float fStack_1a64;
  float local_1a60;
  float fStack_1a5c;
  float fStack_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float fStack_1a48;
  float fStack_1a44;
  float local_1a40;
  float fStack_1a3c;
  float fStack_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float fStack_1a28;
  float fStack_1a24;
  float local_1980;
  float fStack_197c;
  float fStack_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  float fStack_1968;
  float fStack_1964;
  float local_1960;
  float fStack_195c;
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  float fStack_1944;
  float local_1940;
  float fStack_193c;
  float fStack_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float fStack_1928;
  float fStack_1924;
  float local_1920;
  float fStack_191c;
  float fStack_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float fStack_1908;
  float fStack_1904;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float fStack_18e4;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  float local_1800;
  float fStack_17fc;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_1700;
  float fStack_16fc;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  float local_16c0;
  float fStack_16bc;
  float fStack_16b8;
  float fStack_16b4;
  float fStack_16b0;
  float fStack_16ac;
  float fStack_16a8;
  float fStack_16a4;
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  float local_1680;
  float fStack_167c;
  float fStack_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  float fStack_1668;
  float fStack_1664;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float fStack_1564;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  int local_1458;
  int local_1454;
  undefined8 *local_1450;
  undefined8 *local_1448;
  undefined8 *local_1440;
  undefined8 *local_1438;
  undefined8 *local_1430;
  undefined8 *local_13e0;
  int local_1344;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar5 = in_RSI[6];
  lVar6 = in_RDI[7];
  lVar3 = *in_RCX;
  for (local_1344 = 0; local_1344 < (int)lVar6; local_1344 = local_1344 + 1) {
    local_13e0 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_1344 * in_RSI[2]);
    if (lVar3 == 0) {
      local_1b20 = 0;
      uStack_1b18 = 0;
      uStack_1b10 = 0;
      uStack_1b08 = 0;
    }
    else {
      puVar7 = (undefined8 *)(lVar3 + (long)(local_1344 << 3) * 4);
      local_1b20 = *puVar7;
      uStack_1b18 = puVar7[1];
      uStack_1b10 = puVar7[2];
      uStack_1b08 = puVar7[3];
    }
    puVar7 = (undefined8 *)
             (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_1344 * in_RDX[2]);
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    local_1430 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_1344 * in_RDI[2]);
    lVar4 = in_RDI[2];
    local_1438 = (undefined8 *)((long)local_1430 + iVar2 * lVar4);
    local_1440 = (undefined8 *)((long)local_1430 + (long)iVar2 * 2 * lVar4);
    local_1448 = (undefined8 *)((long)local_1430 + (long)iVar2 * 3 * lVar4);
    local_1450 = (undefined8 *)((long)local_1430 + (long)iVar2 * 4 * lVar4);
    for (local_1454 = 0; local_1454 < (int)lVar5; local_1454 = local_1454 + 1) {
      for (local_1458 = 0; local_1458 < iVar1; local_1458 = local_1458 + 1) {
        local_1540 = (float)*puVar7;
        fStack_153c = (float)((ulong)*puVar7 >> 0x20);
        fStack_1538 = (float)puVar7[1];
        fStack_1534 = (float)((ulong)puVar7[1] >> 0x20);
        fStack_1530 = (float)puVar7[2];
        fStack_152c = (float)((ulong)puVar7[2] >> 0x20);
        fStack_1528 = (float)puVar7[3];
        fStack_1524 = (float)((ulong)puVar7[3] >> 0x20);
        local_680 = (float)*local_1430;
        fStack_67c = (float)((ulong)*local_1430 >> 0x20);
        fStack_678 = (float)local_1430[1];
        fStack_674 = (float)((ulong)local_1430[1] >> 0x20);
        fStack_670 = (float)local_1430[2];
        fStack_66c = (float)((ulong)local_1430[2] >> 0x20);
        fStack_668 = (float)local_1430[3];
        local_cc0 = (float)local_1b20;
        fStack_cbc = (float)((ulong)local_1b20 >> 0x20);
        fStack_cb8 = (float)uStack_1b18;
        fStack_cb4 = (float)((ulong)uStack_1b18 >> 0x20);
        fStack_cb0 = (float)uStack_1b10;
        fStack_cac = (float)((ulong)uStack_1b10 >> 0x20);
        fStack_ca8 = (float)uStack_1b08;
        fStack_ca4 = (float)((ulong)uStack_1b08 >> 0x20);
        local_1560 = (float)puVar7[4];
        fStack_155c = (float)((ulong)puVar7[4] >> 0x20);
        fStack_1558 = (float)puVar7[5];
        fStack_1554 = (float)((ulong)puVar7[5] >> 0x20);
        fStack_1550 = (float)puVar7[6];
        fStack_154c = (float)((ulong)puVar7[6] >> 0x20);
        fStack_1548 = (float)puVar7[7];
        fStack_1544 = (float)((ulong)puVar7[7] >> 0x20);
        local_640 = (float)local_1430[4];
        fStack_63c = (float)((ulong)local_1430[4] >> 0x20);
        fStack_638 = (float)local_1430[5];
        fStack_634 = (float)((ulong)local_1430[5] >> 0x20);
        fStack_630 = (float)local_1430[6];
        fStack_62c = (float)((ulong)local_1430[6] >> 0x20);
        fStack_628 = (float)local_1430[7];
        local_1580 = (float)puVar7[8];
        fStack_157c = (float)((ulong)puVar7[8] >> 0x20);
        fStack_1578 = (float)puVar7[9];
        fStack_1574 = (float)((ulong)puVar7[9] >> 0x20);
        fStack_1570 = (float)puVar7[10];
        fStack_156c = (float)((ulong)puVar7[10] >> 0x20);
        fStack_1568 = (float)puVar7[0xb];
        fStack_1564 = (float)((ulong)puVar7[0xb] >> 0x20);
        local_600 = (float)local_1430[8];
        fStack_5fc = (float)((ulong)local_1430[8] >> 0x20);
        fStack_5f8 = (float)local_1430[9];
        fStack_5f4 = (float)((ulong)local_1430[9] >> 0x20);
        fStack_5f0 = (float)local_1430[10];
        fStack_5ec = (float)((ulong)local_1430[10] >> 0x20);
        fStack_5e8 = (float)local_1430[0xb];
        local_15a0 = (float)puVar7[0xc];
        fStack_159c = (float)((ulong)puVar7[0xc] >> 0x20);
        fStack_1598 = (float)puVar7[0xd];
        fStack_1594 = (float)((ulong)puVar7[0xd] >> 0x20);
        fStack_1590 = (float)puVar7[0xe];
        fStack_158c = (float)((ulong)puVar7[0xe] >> 0x20);
        fStack_1588 = (float)puVar7[0xf];
        fStack_1584 = (float)((ulong)puVar7[0xf] >> 0x20);
        local_5c0 = (float)local_1430[0xc];
        fStack_5bc = (float)((ulong)local_1430[0xc] >> 0x20);
        fStack_5b8 = (float)local_1430[0xd];
        fStack_5b4 = (float)((ulong)local_1430[0xd] >> 0x20);
        fStack_5b0 = (float)local_1430[0xe];
        fStack_5ac = (float)((ulong)local_1430[0xe] >> 0x20);
        fStack_5a8 = (float)local_1430[0xf];
        local_15c0 = (float)puVar7[0x10];
        fStack_15bc = (float)((ulong)puVar7[0x10] >> 0x20);
        fStack_15b8 = (float)puVar7[0x11];
        fStack_15b4 = (float)((ulong)puVar7[0x11] >> 0x20);
        fStack_15b0 = (float)puVar7[0x12];
        fStack_15ac = (float)((ulong)puVar7[0x12] >> 0x20);
        fStack_15a8 = (float)puVar7[0x13];
        fStack_15a4 = (float)((ulong)puVar7[0x13] >> 0x20);
        local_580 = (float)local_1430[0x10];
        fStack_57c = (float)((ulong)local_1430[0x10] >> 0x20);
        fStack_578 = (float)local_1430[0x11];
        fStack_574 = (float)((ulong)local_1430[0x11] >> 0x20);
        fStack_570 = (float)local_1430[0x12];
        fStack_56c = (float)((ulong)local_1430[0x12] >> 0x20);
        fStack_568 = (float)local_1430[0x13];
        local_1680 = (float)puVar7[0x14];
        fStack_167c = (float)((ulong)puVar7[0x14] >> 0x20);
        fStack_1678 = (float)puVar7[0x15];
        fStack_1674 = (float)((ulong)puVar7[0x15] >> 0x20);
        fStack_1670 = (float)puVar7[0x16];
        fStack_166c = (float)((ulong)puVar7[0x16] >> 0x20);
        fStack_1668 = (float)puVar7[0x17];
        fStack_1664 = (float)((ulong)puVar7[0x17] >> 0x20);
        local_540 = (float)*local_1438;
        fStack_53c = (float)((ulong)*local_1438 >> 0x20);
        fStack_538 = (float)local_1438[1];
        fStack_534 = (float)((ulong)local_1438[1] >> 0x20);
        fStack_530 = (float)local_1438[2];
        fStack_52c = (float)((ulong)local_1438[2] >> 0x20);
        fStack_528 = (float)local_1438[3];
        local_16a0 = (float)puVar7[0x18];
        fStack_169c = (float)((ulong)puVar7[0x18] >> 0x20);
        fStack_1698 = (float)puVar7[0x19];
        fStack_1694 = (float)((ulong)puVar7[0x19] >> 0x20);
        fStack_1690 = (float)puVar7[0x1a];
        fStack_168c = (float)((ulong)puVar7[0x1a] >> 0x20);
        fStack_1688 = (float)puVar7[0x1b];
        fStack_1684 = (float)((ulong)puVar7[0x1b] >> 0x20);
        local_500 = (float)local_1438[4];
        fStack_4fc = (float)((ulong)local_1438[4] >> 0x20);
        fStack_4f8 = (float)local_1438[5];
        fStack_4f4 = (float)((ulong)local_1438[5] >> 0x20);
        fStack_4f0 = (float)local_1438[6];
        fStack_4ec = (float)((ulong)local_1438[6] >> 0x20);
        fStack_4e8 = (float)local_1438[7];
        local_16c0 = (float)puVar7[0x1c];
        fStack_16bc = (float)((ulong)puVar7[0x1c] >> 0x20);
        fStack_16b8 = (float)puVar7[0x1d];
        fStack_16b4 = (float)((ulong)puVar7[0x1d] >> 0x20);
        fStack_16b0 = (float)puVar7[0x1e];
        fStack_16ac = (float)((ulong)puVar7[0x1e] >> 0x20);
        fStack_16a8 = (float)puVar7[0x1f];
        fStack_16a4 = (float)((ulong)puVar7[0x1f] >> 0x20);
        local_4c0 = (float)local_1438[8];
        fStack_4bc = (float)((ulong)local_1438[8] >> 0x20);
        fStack_4b8 = (float)local_1438[9];
        fStack_4b4 = (float)((ulong)local_1438[9] >> 0x20);
        fStack_4b0 = (float)local_1438[10];
        fStack_4ac = (float)((ulong)local_1438[10] >> 0x20);
        fStack_4a8 = (float)local_1438[0xb];
        local_16e0 = (float)puVar7[0x20];
        fStack_16dc = (float)((ulong)puVar7[0x20] >> 0x20);
        fStack_16d8 = (float)puVar7[0x21];
        fStack_16d4 = (float)((ulong)puVar7[0x21] >> 0x20);
        fStack_16d0 = (float)puVar7[0x22];
        fStack_16cc = (float)((ulong)puVar7[0x22] >> 0x20);
        fStack_16c8 = (float)puVar7[0x23];
        fStack_16c4 = (float)((ulong)puVar7[0x23] >> 0x20);
        local_480 = (float)local_1438[0xc];
        fStack_47c = (float)((ulong)local_1438[0xc] >> 0x20);
        fStack_478 = (float)local_1438[0xd];
        fStack_474 = (float)((ulong)local_1438[0xd] >> 0x20);
        fStack_470 = (float)local_1438[0xe];
        fStack_46c = (float)((ulong)local_1438[0xe] >> 0x20);
        fStack_468 = (float)local_1438[0xf];
        local_1700 = (float)puVar7[0x24];
        fStack_16fc = (float)((ulong)puVar7[0x24] >> 0x20);
        fStack_16f8 = (float)puVar7[0x25];
        fStack_16f4 = (float)((ulong)puVar7[0x25] >> 0x20);
        fStack_16f0 = (float)puVar7[0x26];
        fStack_16ec = (float)((ulong)puVar7[0x26] >> 0x20);
        fStack_16e8 = (float)puVar7[0x27];
        fStack_16e4 = (float)((ulong)puVar7[0x27] >> 0x20);
        local_440 = (float)local_1438[0x10];
        fStack_43c = (float)((ulong)local_1438[0x10] >> 0x20);
        fStack_438 = (float)local_1438[0x11];
        fStack_434 = (float)((ulong)local_1438[0x11] >> 0x20);
        fStack_430 = (float)local_1438[0x12];
        fStack_42c = (float)((ulong)local_1438[0x12] >> 0x20);
        fStack_428 = (float)local_1438[0x13];
        local_17c0 = (float)puVar7[0x28];
        fStack_17bc = (float)((ulong)puVar7[0x28] >> 0x20);
        fStack_17b8 = (float)puVar7[0x29];
        fStack_17b4 = (float)((ulong)puVar7[0x29] >> 0x20);
        fStack_17b0 = (float)puVar7[0x2a];
        fStack_17ac = (float)((ulong)puVar7[0x2a] >> 0x20);
        fStack_17a8 = (float)puVar7[0x2b];
        fStack_17a4 = (float)((ulong)puVar7[0x2b] >> 0x20);
        local_400 = (float)*local_1440;
        fStack_3fc = (float)((ulong)*local_1440 >> 0x20);
        fStack_3f8 = (float)local_1440[1];
        fStack_3f4 = (float)((ulong)local_1440[1] >> 0x20);
        fStack_3f0 = (float)local_1440[2];
        fStack_3ec = (float)((ulong)local_1440[2] >> 0x20);
        fStack_3e8 = (float)local_1440[3];
        local_17e0 = (float)puVar7[0x2c];
        fStack_17dc = (float)((ulong)puVar7[0x2c] >> 0x20);
        fStack_17d8 = (float)puVar7[0x2d];
        fStack_17d4 = (float)((ulong)puVar7[0x2d] >> 0x20);
        fStack_17d0 = (float)puVar7[0x2e];
        fStack_17cc = (float)((ulong)puVar7[0x2e] >> 0x20);
        fStack_17c8 = (float)puVar7[0x2f];
        fStack_17c4 = (float)((ulong)puVar7[0x2f] >> 0x20);
        local_3c0 = (float)local_1440[4];
        fStack_3bc = (float)((ulong)local_1440[4] >> 0x20);
        fStack_3b8 = (float)local_1440[5];
        fStack_3b4 = (float)((ulong)local_1440[5] >> 0x20);
        fStack_3b0 = (float)local_1440[6];
        fStack_3ac = (float)((ulong)local_1440[6] >> 0x20);
        fStack_3a8 = (float)local_1440[7];
        local_1800 = (float)puVar7[0x30];
        fStack_17fc = (float)((ulong)puVar7[0x30] >> 0x20);
        fStack_17f8 = (float)puVar7[0x31];
        fStack_17f4 = (float)((ulong)puVar7[0x31] >> 0x20);
        fStack_17f0 = (float)puVar7[0x32];
        fStack_17ec = (float)((ulong)puVar7[0x32] >> 0x20);
        fStack_17e8 = (float)puVar7[0x33];
        fStack_17e4 = (float)((ulong)puVar7[0x33] >> 0x20);
        local_380 = (float)local_1440[8];
        fStack_37c = (float)((ulong)local_1440[8] >> 0x20);
        fStack_378 = (float)local_1440[9];
        fStack_374 = (float)((ulong)local_1440[9] >> 0x20);
        fStack_370 = (float)local_1440[10];
        fStack_36c = (float)((ulong)local_1440[10] >> 0x20);
        fStack_368 = (float)local_1440[0xb];
        local_1820 = (float)puVar7[0x34];
        fStack_181c = (float)((ulong)puVar7[0x34] >> 0x20);
        fStack_1818 = (float)puVar7[0x35];
        fStack_1814 = (float)((ulong)puVar7[0x35] >> 0x20);
        fStack_1810 = (float)puVar7[0x36];
        fStack_180c = (float)((ulong)puVar7[0x36] >> 0x20);
        fStack_1808 = (float)puVar7[0x37];
        fStack_1804 = (float)((ulong)puVar7[0x37] >> 0x20);
        local_340 = (float)local_1440[0xc];
        fStack_33c = (float)((ulong)local_1440[0xc] >> 0x20);
        fStack_338 = (float)local_1440[0xd];
        fStack_334 = (float)((ulong)local_1440[0xd] >> 0x20);
        fStack_330 = (float)local_1440[0xe];
        fStack_32c = (float)((ulong)local_1440[0xe] >> 0x20);
        fStack_328 = (float)local_1440[0xf];
        local_1840 = (float)puVar7[0x38];
        fStack_183c = (float)((ulong)puVar7[0x38] >> 0x20);
        fStack_1838 = (float)puVar7[0x39];
        fStack_1834 = (float)((ulong)puVar7[0x39] >> 0x20);
        fStack_1830 = (float)puVar7[0x3a];
        fStack_182c = (float)((ulong)puVar7[0x3a] >> 0x20);
        fStack_1828 = (float)puVar7[0x3b];
        fStack_1824 = (float)((ulong)puVar7[0x3b] >> 0x20);
        local_300 = (float)local_1440[0x10];
        fStack_2fc = (float)((ulong)local_1440[0x10] >> 0x20);
        fStack_2f8 = (float)local_1440[0x11];
        fStack_2f4 = (float)((ulong)local_1440[0x11] >> 0x20);
        fStack_2f0 = (float)local_1440[0x12];
        fStack_2ec = (float)((ulong)local_1440[0x12] >> 0x20);
        fStack_2e8 = (float)local_1440[0x13];
        local_1900 = (float)puVar7[0x3c];
        fStack_18fc = (float)((ulong)puVar7[0x3c] >> 0x20);
        fStack_18f8 = (float)puVar7[0x3d];
        fStack_18f4 = (float)((ulong)puVar7[0x3d] >> 0x20);
        fStack_18f0 = (float)puVar7[0x3e];
        fStack_18ec = (float)((ulong)puVar7[0x3e] >> 0x20);
        fStack_18e8 = (float)puVar7[0x3f];
        fStack_18e4 = (float)((ulong)puVar7[0x3f] >> 0x20);
        local_2c0 = (float)*local_1448;
        fStack_2bc = (float)((ulong)*local_1448 >> 0x20);
        fStack_2b8 = (float)local_1448[1];
        fStack_2b4 = (float)((ulong)local_1448[1] >> 0x20);
        fStack_2b0 = (float)local_1448[2];
        fStack_2ac = (float)((ulong)local_1448[2] >> 0x20);
        fStack_2a8 = (float)local_1448[3];
        local_1920 = (float)puVar7[0x40];
        fStack_191c = (float)((ulong)puVar7[0x40] >> 0x20);
        fStack_1918 = (float)puVar7[0x41];
        fStack_1914 = (float)((ulong)puVar7[0x41] >> 0x20);
        fStack_1910 = (float)puVar7[0x42];
        fStack_190c = (float)((ulong)puVar7[0x42] >> 0x20);
        fStack_1908 = (float)puVar7[0x43];
        fStack_1904 = (float)((ulong)puVar7[0x43] >> 0x20);
        local_280 = (float)local_1448[4];
        fStack_27c = (float)((ulong)local_1448[4] >> 0x20);
        fStack_278 = (float)local_1448[5];
        fStack_274 = (float)((ulong)local_1448[5] >> 0x20);
        fStack_270 = (float)local_1448[6];
        fStack_26c = (float)((ulong)local_1448[6] >> 0x20);
        fStack_268 = (float)local_1448[7];
        local_1940 = (float)puVar7[0x44];
        fStack_193c = (float)((ulong)puVar7[0x44] >> 0x20);
        fStack_1938 = (float)puVar7[0x45];
        fStack_1934 = (float)((ulong)puVar7[0x45] >> 0x20);
        fStack_1930 = (float)puVar7[0x46];
        fStack_192c = (float)((ulong)puVar7[0x46] >> 0x20);
        fStack_1928 = (float)puVar7[0x47];
        fStack_1924 = (float)((ulong)puVar7[0x47] >> 0x20);
        local_240 = (float)local_1448[8];
        fStack_23c = (float)((ulong)local_1448[8] >> 0x20);
        fStack_238 = (float)local_1448[9];
        fStack_234 = (float)((ulong)local_1448[9] >> 0x20);
        fStack_230 = (float)local_1448[10];
        fStack_22c = (float)((ulong)local_1448[10] >> 0x20);
        fStack_228 = (float)local_1448[0xb];
        local_1960 = (float)puVar7[0x48];
        fStack_195c = (float)((ulong)puVar7[0x48] >> 0x20);
        fStack_1958 = (float)puVar7[0x49];
        fStack_1954 = (float)((ulong)puVar7[0x49] >> 0x20);
        fStack_1950 = (float)puVar7[0x4a];
        fStack_194c = (float)((ulong)puVar7[0x4a] >> 0x20);
        fStack_1948 = (float)puVar7[0x4b];
        fStack_1944 = (float)((ulong)puVar7[0x4b] >> 0x20);
        local_200 = (float)local_1448[0xc];
        fStack_1fc = (float)((ulong)local_1448[0xc] >> 0x20);
        fStack_1f8 = (float)local_1448[0xd];
        fStack_1f4 = (float)((ulong)local_1448[0xd] >> 0x20);
        fStack_1f0 = (float)local_1448[0xe];
        fStack_1ec = (float)((ulong)local_1448[0xe] >> 0x20);
        fStack_1e8 = (float)local_1448[0xf];
        local_1980 = (float)puVar7[0x4c];
        fStack_197c = (float)((ulong)puVar7[0x4c] >> 0x20);
        fStack_1978 = (float)puVar7[0x4d];
        fStack_1974 = (float)((ulong)puVar7[0x4d] >> 0x20);
        fStack_1970 = (float)puVar7[0x4e];
        fStack_196c = (float)((ulong)puVar7[0x4e] >> 0x20);
        fStack_1968 = (float)puVar7[0x4f];
        fStack_1964 = (float)((ulong)puVar7[0x4f] >> 0x20);
        local_1c0 = (float)local_1448[0x10];
        fStack_1bc = (float)((ulong)local_1448[0x10] >> 0x20);
        fStack_1b8 = (float)local_1448[0x11];
        fStack_1b4 = (float)((ulong)local_1448[0x11] >> 0x20);
        fStack_1b0 = (float)local_1448[0x12];
        fStack_1ac = (float)((ulong)local_1448[0x12] >> 0x20);
        fStack_1a8 = (float)local_1448[0x13];
        local_1a40 = (float)puVar7[0x50];
        fStack_1a3c = (float)((ulong)puVar7[0x50] >> 0x20);
        fStack_1a38 = (float)puVar7[0x51];
        fStack_1a34 = (float)((ulong)puVar7[0x51] >> 0x20);
        fStack_1a30 = (float)puVar7[0x52];
        fStack_1a2c = (float)((ulong)puVar7[0x52] >> 0x20);
        fStack_1a28 = (float)puVar7[0x53];
        fStack_1a24 = (float)((ulong)puVar7[0x53] >> 0x20);
        local_180 = (float)*local_1450;
        fStack_17c = (float)((ulong)*local_1450 >> 0x20);
        fStack_178 = (float)local_1450[1];
        fStack_174 = (float)((ulong)local_1450[1] >> 0x20);
        fStack_170 = (float)local_1450[2];
        fStack_16c = (float)((ulong)local_1450[2] >> 0x20);
        fStack_168 = (float)local_1450[3];
        local_1a60 = (float)puVar7[0x54];
        fStack_1a5c = (float)((ulong)puVar7[0x54] >> 0x20);
        fStack_1a58 = (float)puVar7[0x55];
        fStack_1a54 = (float)((ulong)puVar7[0x55] >> 0x20);
        fStack_1a50 = (float)puVar7[0x56];
        fStack_1a4c = (float)((ulong)puVar7[0x56] >> 0x20);
        fStack_1a48 = (float)puVar7[0x57];
        fStack_1a44 = (float)((ulong)puVar7[0x57] >> 0x20);
        local_140 = (float)local_1450[4];
        fStack_13c = (float)((ulong)local_1450[4] >> 0x20);
        fStack_138 = (float)local_1450[5];
        fStack_134 = (float)((ulong)local_1450[5] >> 0x20);
        fStack_130 = (float)local_1450[6];
        fStack_12c = (float)((ulong)local_1450[6] >> 0x20);
        fStack_128 = (float)local_1450[7];
        local_1a80 = (float)puVar7[0x58];
        fStack_1a7c = (float)((ulong)puVar7[0x58] >> 0x20);
        fStack_1a78 = (float)puVar7[0x59];
        fStack_1a74 = (float)((ulong)puVar7[0x59] >> 0x20);
        fStack_1a70 = (float)puVar7[0x5a];
        fStack_1a6c = (float)((ulong)puVar7[0x5a] >> 0x20);
        fStack_1a68 = (float)puVar7[0x5b];
        fStack_1a64 = (float)((ulong)puVar7[0x5b] >> 0x20);
        local_100 = (float)local_1450[8];
        fStack_fc = (float)((ulong)local_1450[8] >> 0x20);
        fStack_f8 = (float)local_1450[9];
        fStack_f4 = (float)((ulong)local_1450[9] >> 0x20);
        fStack_f0 = (float)local_1450[10];
        fStack_ec = (float)((ulong)local_1450[10] >> 0x20);
        fStack_e8 = (float)local_1450[0xb];
        local_1aa0 = (float)puVar7[0x5c];
        fStack_1a9c = (float)((ulong)puVar7[0x5c] >> 0x20);
        fStack_1a98 = (float)puVar7[0x5d];
        fStack_1a94 = (float)((ulong)puVar7[0x5d] >> 0x20);
        fStack_1a90 = (float)puVar7[0x5e];
        fStack_1a8c = (float)((ulong)puVar7[0x5e] >> 0x20);
        fStack_1a88 = (float)puVar7[0x5f];
        fStack_1a84 = (float)((ulong)puVar7[0x5f] >> 0x20);
        local_c0 = (float)local_1450[0xc];
        fStack_bc = (float)((ulong)local_1450[0xc] >> 0x20);
        fStack_b8 = (float)local_1450[0xd];
        fStack_b4 = (float)((ulong)local_1450[0xd] >> 0x20);
        fStack_b0 = (float)local_1450[0xe];
        fStack_ac = (float)((ulong)local_1450[0xe] >> 0x20);
        fStack_a8 = (float)local_1450[0xf];
        local_1ac0 = (float)puVar7[0x60];
        fStack_1abc = (float)((ulong)puVar7[0x60] >> 0x20);
        fStack_1ab8 = (float)puVar7[0x61];
        fStack_1ab4 = (float)((ulong)puVar7[0x61] >> 0x20);
        fStack_1ab0 = (float)puVar7[0x62];
        fStack_1aac = (float)((ulong)puVar7[0x62] >> 0x20);
        fStack_1aa8 = (float)puVar7[99];
        fStack_1aa4 = (float)((ulong)puVar7[99] >> 0x20);
        local_80 = (float)local_1450[0x10];
        fStack_7c = (float)((ulong)local_1450[0x10] >> 0x20);
        fStack_78 = (float)local_1450[0x11];
        fStack_74 = (float)((ulong)local_1450[0x11] >> 0x20);
        fStack_70 = (float)local_1450[0x12];
        fStack_6c = (float)((ulong)local_1450[0x12] >> 0x20);
        fStack_68 = (float)local_1450[0x13];
        *local_13e0 = CONCAT44(fStack_1abc * fStack_7c +
                               fStack_1a9c * fStack_bc +
                               fStack_1a7c * fStack_fc +
                               fStack_1a5c * fStack_13c +
                               fStack_1a3c * fStack_17c +
                               fStack_197c * fStack_1bc +
                               fStack_195c * fStack_1fc +
                               fStack_193c * fStack_23c +
                               fStack_191c * fStack_27c +
                               fStack_18fc * fStack_2bc +
                               fStack_183c * fStack_2fc +
                               fStack_181c * fStack_33c +
                               fStack_17fc * fStack_37c +
                               fStack_17dc * fStack_3bc +
                               fStack_17bc * fStack_3fc +
                               fStack_16fc * fStack_43c +
                               fStack_16dc * fStack_47c +
                               fStack_16bc * fStack_4bc +
                               fStack_169c * fStack_4fc +
                               fStack_167c * fStack_53c +
                               fStack_15bc * fStack_57c +
                               fStack_159c * fStack_5bc +
                               fStack_157c * fStack_5fc +
                               fStack_155c * fStack_63c + fStack_153c * fStack_67c + fStack_cbc,
                               local_1ac0 * local_80 +
                               local_1aa0 * local_c0 +
                               local_1a80 * local_100 +
                               local_1a60 * local_140 +
                               local_1a40 * local_180 +
                               local_1980 * local_1c0 +
                               local_1960 * local_200 +
                               local_1940 * local_240 +
                               local_1920 * local_280 +
                               local_1900 * local_2c0 +
                               local_1840 * local_300 +
                               local_1820 * local_340 +
                               local_1800 * local_380 +
                               local_17e0 * local_3c0 +
                               local_17c0 * local_400 +
                               local_1700 * local_440 +
                               local_16e0 * local_480 +
                               local_16c0 * local_4c0 +
                               local_16a0 * local_500 +
                               local_1680 * local_540 +
                               local_15c0 * local_580 +
                               local_15a0 * local_5c0 +
                               local_1580 * local_600 +
                               local_1560 * local_640 + local_1540 * local_680 + local_cc0);
        local_13e0[1] =
             CONCAT44(fStack_1ab4 * fStack_74 +
                      fStack_1a94 * fStack_b4 +
                      fStack_1a74 * fStack_f4 +
                      fStack_1a54 * fStack_134 +
                      fStack_1a34 * fStack_174 +
                      fStack_1974 * fStack_1b4 +
                      fStack_1954 * fStack_1f4 +
                      fStack_1934 * fStack_234 +
                      fStack_1914 * fStack_274 +
                      fStack_18f4 * fStack_2b4 +
                      fStack_1834 * fStack_2f4 +
                      fStack_1814 * fStack_334 +
                      fStack_17f4 * fStack_374 +
                      fStack_17d4 * fStack_3b4 +
                      fStack_17b4 * fStack_3f4 +
                      fStack_16f4 * fStack_434 +
                      fStack_16d4 * fStack_474 +
                      fStack_16b4 * fStack_4b4 +
                      fStack_1694 * fStack_4f4 +
                      fStack_1674 * fStack_534 +
                      fStack_15b4 * fStack_574 +
                      fStack_1594 * fStack_5b4 +
                      fStack_1574 * fStack_5f4 +
                      fStack_1554 * fStack_634 + fStack_1534 * fStack_674 + fStack_cb4,
                      fStack_1ab8 * fStack_78 +
                      fStack_1a98 * fStack_b8 +
                      fStack_1a78 * fStack_f8 +
                      fStack_1a58 * fStack_138 +
                      fStack_1a38 * fStack_178 +
                      fStack_1978 * fStack_1b8 +
                      fStack_1958 * fStack_1f8 +
                      fStack_1938 * fStack_238 +
                      fStack_1918 * fStack_278 +
                      fStack_18f8 * fStack_2b8 +
                      fStack_1838 * fStack_2f8 +
                      fStack_1818 * fStack_338 +
                      fStack_17f8 * fStack_378 +
                      fStack_17d8 * fStack_3b8 +
                      fStack_17b8 * fStack_3f8 +
                      fStack_16f8 * fStack_438 +
                      fStack_16d8 * fStack_478 +
                      fStack_16b8 * fStack_4b8 +
                      fStack_1698 * fStack_4f8 +
                      fStack_1678 * fStack_538 +
                      fStack_15b8 * fStack_578 +
                      fStack_1598 * fStack_5b8 +
                      fStack_1578 * fStack_5f8 +
                      fStack_1558 * fStack_638 + fStack_1538 * fStack_678 + fStack_cb8);
        local_13e0[2] =
             CONCAT44(fStack_1aac * fStack_6c +
                      fStack_1a8c * fStack_ac +
                      fStack_1a6c * fStack_ec +
                      fStack_1a4c * fStack_12c +
                      fStack_1a2c * fStack_16c +
                      fStack_196c * fStack_1ac +
                      fStack_194c * fStack_1ec +
                      fStack_192c * fStack_22c +
                      fStack_190c * fStack_26c +
                      fStack_18ec * fStack_2ac +
                      fStack_182c * fStack_2ec +
                      fStack_180c * fStack_32c +
                      fStack_17ec * fStack_36c +
                      fStack_17cc * fStack_3ac +
                      fStack_17ac * fStack_3ec +
                      fStack_16ec * fStack_42c +
                      fStack_16cc * fStack_46c +
                      fStack_16ac * fStack_4ac +
                      fStack_168c * fStack_4ec +
                      fStack_166c * fStack_52c +
                      fStack_15ac * fStack_56c +
                      fStack_158c * fStack_5ac +
                      fStack_156c * fStack_5ec +
                      fStack_154c * fStack_62c + fStack_152c * fStack_66c + fStack_cac,
                      fStack_1ab0 * fStack_70 +
                      fStack_1a90 * fStack_b0 +
                      fStack_1a70 * fStack_f0 +
                      fStack_1a50 * fStack_130 +
                      fStack_1a30 * fStack_170 +
                      fStack_1970 * fStack_1b0 +
                      fStack_1950 * fStack_1f0 +
                      fStack_1930 * fStack_230 +
                      fStack_1910 * fStack_270 +
                      fStack_18f0 * fStack_2b0 +
                      fStack_1830 * fStack_2f0 +
                      fStack_1810 * fStack_330 +
                      fStack_17f0 * fStack_370 +
                      fStack_17d0 * fStack_3b0 +
                      fStack_17b0 * fStack_3f0 +
                      fStack_16f0 * fStack_430 +
                      fStack_16d0 * fStack_470 +
                      fStack_16b0 * fStack_4b0 +
                      fStack_1690 * fStack_4f0 +
                      fStack_1670 * fStack_530 +
                      fStack_15b0 * fStack_570 +
                      fStack_1590 * fStack_5b0 +
                      fStack_1570 * fStack_5f0 +
                      fStack_1550 * fStack_630 + fStack_1530 * fStack_670 + fStack_cb0);
        local_13e0[3] =
             CONCAT44(fStack_1aa4 +
                      fStack_1a84 +
                      fStack_1a64 +
                      fStack_1a44 +
                      fStack_1a24 +
                      fStack_1964 +
                      fStack_1944 +
                      fStack_1924 +
                      fStack_1904 +
                      fStack_18e4 +
                      fStack_1824 +
                      fStack_1804 +
                      fStack_17e4 +
                      fStack_17c4 +
                      fStack_17a4 +
                      fStack_16e4 +
                      fStack_16c4 +
                      fStack_16a4 +
                      fStack_1684 +
                      fStack_1664 +
                      fStack_15a4 +
                      fStack_1584 + fStack_1564 + fStack_1544 + fStack_1524 + fStack_ca4,
                      fStack_1aa8 * fStack_68 +
                      fStack_1a88 * fStack_a8 +
                      fStack_1a68 * fStack_e8 +
                      fStack_1a48 * fStack_128 +
                      fStack_1a28 * fStack_168 +
                      fStack_1968 * fStack_1a8 +
                      fStack_1948 * fStack_1e8 +
                      fStack_1928 * fStack_228 +
                      fStack_1908 * fStack_268 +
                      fStack_18e8 * fStack_2a8 +
                      fStack_1828 * fStack_2e8 +
                      fStack_1808 * fStack_328 +
                      fStack_17e8 * fStack_368 +
                      fStack_17c8 * fStack_3a8 +
                      fStack_17a8 * fStack_3e8 +
                      fStack_16e8 * fStack_428 +
                      fStack_16c8 * fStack_468 +
                      fStack_16a8 * fStack_4a8 +
                      fStack_1688 * fStack_4e8 +
                      fStack_1668 * fStack_528 +
                      fStack_15a8 * fStack_568 +
                      fStack_1588 * fStack_5a8 +
                      fStack_1568 * fStack_5e8 +
                      fStack_1548 * fStack_628 + fStack_1528 * fStack_668 + fStack_ca8);
        local_1430 = local_1430 + 4;
        local_1438 = local_1438 + 4;
        local_1440 = local_1440 + 4;
        local_1448 = local_1448 + 4;
        local_1450 = local_1450 + 4;
        local_13e0 = local_13e0 + 4;
      }
      local_1430 = local_1430 + 0x10;
      local_1438 = local_1438 + 0x10;
      local_1440 = local_1440 + 0x10;
      local_1448 = local_1448 + 0x10;
      local_1450 = local_1450 + 0x10;
    }
  }
  return;
}

Assistant:

static void convdw5x5s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);
                __m256 _k03 = _mm256_load_ps(k0 + 24);
                __m256 _k04 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);

                __m256 _k10 = _mm256_load_ps(k0);
                __m256 _k11 = _mm256_load_ps(k0 + 8);
                __m256 _k12 = _mm256_load_ps(k0 + 16);
                __m256 _k13 = _mm256_load_ps(k0 + 24);
                __m256 _k14 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);

                __m256 _k20 = _mm256_load_ps(k0);
                __m256 _k21 = _mm256_load_ps(k0 + 8);
                __m256 _k22 = _mm256_load_ps(k0 + 16);
                __m256 _k23 = _mm256_load_ps(k0 + 24);
                __m256 _k24 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k24, _r24, _sum0);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);
                __m256 _r34 = _mm256_load_ps(r3 + 32);

                __m256 _k30 = _mm256_load_ps(k0);
                __m256 _k31 = _mm256_load_ps(k0 + 8);
                __m256 _k32 = _mm256_load_ps(k0 + 16);
                __m256 _k33 = _mm256_load_ps(k0 + 24);
                __m256 _k34 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k34, _r34, _sum0);

                __m256 _r40 = _mm256_load_ps(r4);
                __m256 _r41 = _mm256_load_ps(r4 + 8);
                __m256 _r42 = _mm256_load_ps(r4 + 16);
                __m256 _r43 = _mm256_load_ps(r4 + 24);
                __m256 _r44 = _mm256_load_ps(r4 + 32);

                __m256 _k40 = _mm256_load_ps(k0);
                __m256 _k41 = _mm256_load_ps(k0 + 8);
                __m256 _k42 = _mm256_load_ps(k0 + 16);
                __m256 _k43 = _mm256_load_ps(k0 + 24);
                __m256 _k44 = _mm256_load_ps(k0 + 32);
                k0 -= 160;

                _sum0 = _mm256_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                r3 += 8;
                r4 += 8;
                outptr0 += 8;
            }

            r0 += 4 * 8;
            r1 += 4 * 8;
            r2 += 4 * 8;
            r3 += 4 * 8;
            r4 += 4 * 8;
        }
    }
}